

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeyboard.cpp
# Opt level: O0

bool __thiscall OIS::LinuxKeyboard::_injectKeyUp(LinuxKeyboard *this,KeyCode kc)

{
  uint in_ESI;
  long in_RDI;
  long *plVar1;
  Object *obj;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  uint local_14;
  byte local_1;
  
  local_14 = in_ESI;
  if (0xff < (int)in_ESI) {
    local_14 = 0;
  }
  *(undefined1 *)(in_RDI + 200 + (ulong)local_14) = 0;
  if ((local_14 == 0x1d) || (local_14 == 0x9d)) {
    *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) & 0xffffffef;
  }
  else if ((local_14 == 0x2a) || (local_14 == 0x36)) {
    *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) & 0xfffffffe;
  }
  else if ((local_14 == 0x38) || (local_14 == 0xb8)) {
    *(uint *)(in_RDI + 0x40) = *(uint *)(in_RDI + 0x40) & 0xfffffeff;
  }
  if (((*(byte *)(in_RDI + 0x2c) & 1) == 0) || (*(long *)(in_RDI + 0x48) == 0)) {
    local_1 = 1;
  }
  else {
    plVar1 = *(long **)(in_RDI + 0x48);
    obj = (Object *)&stack0xffffffffffffffd0;
    KeyEvent::KeyEvent((KeyEvent *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),obj
                       ,(KeyCode)((ulong)plVar1 >> 0x20),(uint)plVar1);
    local_1 = (**(code **)(*plVar1 + 0x18))(plVar1,obj);
    local_1 = local_1 & 1;
    KeyEvent::~KeyEvent((KeyEvent *)0x165ce6);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LinuxKeyboard::_injectKeyUp(KeyCode kc)
{
	if(kc > 255) kc = KC_UNASSIGNED;
	KeyBuffer[kc] = 0;

	//Turn off modifier flags
	if(kc == KC_LCONTROL || kc == KC_RCONTROL)
		mModifiers &= ~Ctrl;
	else if(kc == KC_LSHIFT || kc == KC_RSHIFT)
		mModifiers &= ~Shift;
	else if(kc == KC_LMENU || kc == KC_RMENU)
		mModifiers &= ~Alt;

	if(mBuffered && mListener)
		return mListener->keyReleased(KeyEvent(this, kc, 0));

	return true;
}